

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  code *pcVar2;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar3;
  size_t sVar4;
  secp256k1_gej *r_00;
  ulong uVar5;
  secp256k1_scratch *scratch_00;
  ulong uVar6;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  long lVar7;
  ulong uVar8;
  size_t size;
  uchar bytes [65];
  secp256k1_scalar zero;
  secp256k1_ge r;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  ulong uStack_1628;
  secp256k1_strauss_state sStack_1618;
  secp256k1_strauss_point_state sStack_1600;
  secp256k1_fe asStack_11f0 [8];
  secp256k1_ge asStack_1070 [8];
  size_t *psStack_d28;
  secp256k1_gej *psStack_d20;
  secp256k1_scalar *psStack_d18;
  secp256k1_sha256 *psStack_d10;
  secp256k1_gej *psStack_d08;
  secp256k1_strauss_point_state *psStack_d00;
  size_t sStack_cf0;
  size_t local_ce0;
  secp256k1_scratch local_cd8 [2];
  secp256k1_scalar local_c88;
  secp256k1_ge local_c68;
  secp256k1_gej local_c00;
  secp256k1_gej local_b68;
  secp256k1_gej local_ad0;
  secp256k1_gej local_a38;
  secp256k1_gej local_9a0;
  secp256k1_gej local_908 [2];
  secp256k1_gej local_788 [5];
  secp256k1_strauss_point_state local_448;
  
  local_c88.d[2] = 0;
  local_c88.d[3] = 0;
  local_c88.d[0] = 0;
  local_c88.d[1] = 0;
  local_ce0 = 0x41;
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a38f;
  secp256k1_gej_set_ge(&local_b68,&secp256k1_ge_const_g);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a39c;
  secp256k1_gej_set_infinity(&local_c00);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a3b3;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9a0,x);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a3fe;
  local_ad0.x.n[0] = (uint64_t)local_908;
  local_ad0.x.n[1] = (uint64_t)local_788;
  local_ad0.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_ad0,&local_a38,1,&local_b68,x,&local_c88);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a434;
  local_c68.x.n[0] = (uint64_t)local_908;
  local_c68.x.n[1] = (uint64_t)local_788;
  local_c68.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_c68,&local_ad0,1,&local_c00,&local_c88,x);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a45a;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&local_448,x,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a484;
  cbdata = x;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,local_788,&local_c88,test_ecmult_accumulate_cb,x,1);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a49e;
  secp256k1_ecmult_const(local_908,&secp256k1_ge_const_g,x);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4b6;
  secp256k1_ge_set_gej_var(&local_c68,&local_9a0);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4c6;
  ge_equals_gej(&local_c68,&local_a38);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4d1;
  ge_equals_gej(&local_c68,&local_ad0);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4dc;
  ge_equals_gej(&local_c68,(secp256k1_gej *)&local_448);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4e7;
  ge_equals_gej(&local_c68,local_788);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4f2;
  ge_equals_gej(&local_c68,local_908);
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a4fa;
  secp256k1_ge_verify(&local_c68);
  if (local_c68.infinity == 0) {
    elem = &local_c68;
    scratch_00 = local_cd8;
    ng = (secp256k1_scalar *)0x0;
    psStack_d00 = (secp256k1_strauss_point_state *)0x15a536;
    secp256k1_eckey_pubkey_serialize(elem,scratch_00->magic,&local_ce0,0);
    if (local_ce0 != 0x41) {
      psStack_d00 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      psStack_d28 = &local_ce0;
      psStack_d20 = local_908;
      psStack_d18 = &local_c88;
      psStack_d10 = acc;
      psStack_d08 = &local_ad0;
      psStack_d00 = &local_448;
      secp256k1_gej_set_infinity(r_00);
      if (ng != (secp256k1_scalar *)0x0 || sStack_cf0 != 0) {
        if (sStack_cf0 != 0) {
          if (scratch_00 != (secp256k1_scratch *)0x0) {
            sVar4 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,scratch_00);
            uVar6 = sStack_cf0;
            if (sVar4 != 0) {
              uVar6 = 5000000;
              if (sVar4 < 5000000) {
                uVar6 = sVar4;
              }
              uStack_1628 = (sStack_cf0 - 1) / uVar6 + 1;
              uVar6 = (sStack_cf0 - 1) / uStack_1628 + 1;
            }
            if (sVar4 != 0) {
              if (uVar6 < 0x58) {
                sVar4 = secp256k1_scratch_max_allocation((secp256k1_callback *)elem,scratch_00,5);
                if (0x987 < sVar4) {
                  uVar6 = sVar4 / 0x988;
                  if (4999999 < uVar6) {
                    uVar6 = 5000000;
                  }
                  uStack_1628 = (sStack_cf0 - 1) / uVar6 + 1;
                  uVar6 = (sStack_cf0 - 1) / uStack_1628 + 1;
                }
                if (sVar4 < 0x988) goto LAB_0015a6fe;
                pcVar2 = secp256k1_ecmult_strauss_batch;
              }
              else {
                pcVar2 = secp256k1_ecmult_pippenger_batch;
              }
              lVar7 = 0;
              uVar5 = 0;
              while( true ) {
                uVar8 = uVar6;
                if (sStack_cf0 < uVar6) {
                  uVar8 = sStack_cf0;
                }
                psVar3 = (secp256k1_scalar *)0x0;
                if (uVar5 == 0) {
                  psVar3 = ng;
                }
                iVar1 = (*pcVar2)(elem,scratch_00,&sStack_1600,psVar3,cb,cbdata,uVar8,lVar7);
                if (iVar1 == 0) break;
                secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_1600,(secp256k1_fe *)0x0);
                sStack_cf0 = sStack_cf0 - uVar8;
                uVar5 = uVar5 + 1;
                lVar7 = lVar7 + uVar6;
                if (uStack_1628 == uVar5) {
                  return;
                }
              }
              return;
            }
          }
LAB_0015a6fe:
          secp256k1_ecmult_multi_simple_var(r_00,ng,cb,cbdata,sStack_cf0);
          return;
        }
        sStack_1618.aux = asStack_11f0;
        sStack_1618.pre_a = asStack_1070;
        sStack_1618.ps = &sStack_1600;
        secp256k1_ecmult_strauss_wnaf(&sStack_1618,r_00,1,r_00,&secp256k1_scalar_zero,ng);
      }
      return;
    }
    sVar4 = 0x41;
  }
  else {
    local_cd8[0].magic[0] = '\0';
    sVar4 = 1;
  }
  psStack_d00 = (secp256k1_strauss_point_state *)0x15a54c;
  secp256k1_sha256_write(acc,local_cd8[0].magic,sVar4);
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &zero);
    secp256k1_ecmult(&rj3, &infj, &zero, x);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj4, x, NULL, NULL, 0);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj5, &zero, test_ecmult_accumulate_cb, (void*)x, 1);
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    ge_equals_gej(&r, &rj2);
    ge_equals_gej(&r, &rj3);
    ge_equals_gej(&r, &rj4);
    ge_equals_gej(&r, &rj5);
    ge_equals_gej(&r, &rj6);
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}